

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O0

int l_strcmp(TString *ls,TString *rs)

{
  int iVar1;
  TString *pTVar2;
  undefined1 *puVar3;
  TString *local_60;
  TString *local_58;
  size_t len;
  TString *pTStack_40;
  int temp;
  size_t lr;
  char *r;
  size_t ll;
  char *l;
  TString *rs_local;
  TString *ls_local;
  
  ll = (size_t)(ls + 1);
  if (ls->tt == '\x04') {
    local_58 = (TString *)(ulong)ls->shrlen;
  }
  else {
    local_58 = (ls->u).hnext;
  }
  r = (char *)local_58;
  lr = (size_t)(rs + 1);
  if (rs->tt == '\x04') {
    local_60 = (TString *)(ulong)rs->shrlen;
  }
  else {
    local_60 = (rs->u).hnext;
  }
  pTStack_40 = local_60;
  while( true ) {
    iVar1 = strcoll((char *)ll,(char *)lr);
    if (iVar1 != 0) {
      return iVar1;
    }
    pTVar2 = (TString *)strlen((char *)ll);
    if (pTVar2 == pTStack_40) break;
    if (pTVar2 == (TString *)r) {
      return -1;
    }
    puVar3 = (undefined1 *)((long)&pTVar2->next + 1);
    ll = (size_t)(puVar3 + ll);
    r = r + -(long)puVar3;
    lr = (size_t)(puVar3 + lr);
    pTStack_40 = (TString *)((long)pTStack_40 - (long)puVar3);
  }
  return (uint)(pTVar2 != (TString *)r);
}

Assistant:

static int l_strcmp (const TString *ls, const TString *rs) {
  const char *l = getstr(ls);
  size_t ll = tsslen(ls);
  const char *r = getstr(rs);
  size_t lr = tsslen(rs);
  for (;;) {  /* for each segment */
    int temp = strcoll(l, r);
    if (temp != 0)  /* not equal? */
      return temp;  /* done */
    else {  /* strings are equal up to a '\0' */
      size_t len = strlen(l);  /* index of first '\0' in both strings */
      if (len == lr)  /* 'rs' is finished? */
        return (len == ll) ? 0 : 1;  /* check 'ls' */
      else if (len == ll)  /* 'ls' is finished? */
        return -1;  /* 'ls' is smaller than 'rs' ('rs' is not finished) */
      /* both strings longer than 'len'; go on comparing after the '\0' */
      len++;
      l += len; ll -= len; r += len; lr -= len;
    }
  }
}